

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::BeginPopupEx(ImGuiID id,ImGuiWindowFlags extra_flags)

{
  bool bVar1;
  byte bVar2;
  uint in_ESI;
  uint in_EDI;
  bool is_open;
  char name [20];
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000664;
  bool *in_stack_00000668;
  char *in_stack_00000670;
  ImGuiID in_stack_ffffffffffffffc4;
  char local_38 [32];
  ImGuiContext *local_18;
  uint local_c;
  uint local_8;
  bool local_1;
  
  local_18 = GImGui;
  local_c = in_ESI;
  local_8 = in_EDI;
  bVar1 = IsPopupOpen(in_stack_ffffffffffffffc4);
  if (bVar1) {
    if ((local_c & 0x10000000) == 0) {
      ImFormatString(local_38,0x14,"##Popup_%08x",(ulong)local_8);
    }
    else {
      ImFormatString(local_38,0x14,"##Menu_%02d",(ulong)(uint)(local_18->BeginPopupStack).Size);
    }
    bVar2 = Begin(in_stack_00000670,in_stack_00000668,in_stack_00000664);
    if (!(bool)bVar2) {
      EndPopup();
    }
    local_1 = (bool)(bVar2 & 1);
  }
  else {
    ImGuiNextWindowData::Clear(&local_18->NextWindowData);
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool ImGui::BeginPopupEx(ImGuiID id, ImGuiWindowFlags extra_flags)
{
    ImGuiContext& g = *GImGui;
    if (!IsPopupOpen(id))
    {
        g.NextWindowData.Clear(); // We behave like Begin() and need to consume those values
        return false;
    }

    char name[20];
    if (extra_flags & ImGuiWindowFlags_ChildMenu)
        ImFormatString(name, IM_ARRAYSIZE(name), "##Menu_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth
    else
        ImFormatString(name, IM_ARRAYSIZE(name), "##Popup_%08x", id); // Not recycling, so we can close/open during the same frame

    bool is_open = Begin(name, NULL, extra_flags | ImGuiWindowFlags_Popup);
    if (!is_open) // NB: Begin can return false when the popup is completely clipped (e.g. zero size display)
        EndPopup();

    return is_open;
}